

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O3

void ApplyInverseTransforms(VP8LDecoder *dec,int start_row,int num_rows,uint32_t *rows)

{
  uint32_t *out;
  long lVar1;
  ulong uVar2;
  VP8LTransform *transform;
  
  lVar1 = (long)dec->next_transform;
  out = dec->argb_cache;
  if (lVar1 < 1) {
    if (out != rows) {
      memcpy(out,rows,(long)num_rows * (long)dec->width * 4);
      return;
    }
  }
  else {
    uVar2 = lVar1 + 1;
    transform = dec->transforms + lVar1 + -1;
    do {
      VP8LInverseTransform(transform,start_row,num_rows + start_row,rows,out);
      uVar2 = uVar2 - 1;
      transform = transform + -1;
      rows = out;
    } while (1 < uVar2);
  }
  return;
}

Assistant:

static void ApplyInverseTransforms(VP8LDecoder* const dec,
                                   int start_row, int num_rows,
                                   const uint32_t* const rows) {
  int n = dec->next_transform;
  const int cache_pixs = dec->width * num_rows;
  const int end_row = start_row + num_rows;
  const uint32_t* rows_in = rows;
  uint32_t* const rows_out = dec->argb_cache;

  // Inverse transforms.
  while (n-- > 0) {
    VP8LTransform* const transform = &dec->transforms[n];
    VP8LInverseTransform(transform, start_row, end_row, rows_in, rows_out);
    rows_in = rows_out;
  }
  if (rows_in != rows_out) {
    // No transform called, hence just copy.
    memcpy(rows_out, rows_in, cache_pixs * sizeof(*rows_out));
  }
}